

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O2

int32_t main(int32_t argc,char **argv)

{
  char cVar1;
  Btor2SortTag BVar2;
  int64_t iVar3;
  int iVar4;
  int32_t iVar5;
  uint uVar6;
  BtorSimVCDWriter *pBVar7;
  undefined8 uVar8;
  Btor2Line *pBVar9;
  pointer ppBVar10;
  value_type pBVar11;
  pointer plVar12;
  undefined8 extraout_RAX;
  pointer ppBVar13;
  pointer plVar14;
  long lVar15;
  int64_t iVar16;
  char *pcVar17;
  vector<Btor2Line_*,_std::allocator<Btor2Line_*>_> *this;
  char *pcVar18;
  int iVar19;
  int64_t i;
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint local_90;
  int32_t local_8c;
  char *local_88;
  int64_t fake_justice;
  int64_t fake_bad;
  int32_t ch;
  long local_68;
  undefined1 local_60 [48];
  
  fake_bad = -1;
  fake_justice = -1;
  local_8c = -1;
  local_90 = 0xffffffff;
  local_88 = (char *)0x0;
  for (iVar19 = 1; iVar19 < argc; iVar19 = iVar19 + 1) {
    pcVar18 = argv[iVar19];
    cVar1 = *pcVar18;
    if (cVar1 == '-') {
      if ((pcVar18[1] == 'h') && (pcVar18[2] == '\0')) {
        fputs("usage: btorsim [ <option> ... ] [ <btor> [ <witness> ] ]\n\nwhere <option> is one of the following\n\n  -h        print this command line option summary\n  -c        check only <witness> and do not print trace\n  -v        increase verbosity level (multiple times if necessary)\n  -r <n>    generate <n> random transitions (default 20)\n  -s <s>    random seed (default \'0\')\n\n  -b <n>    fake simulation to satisfy bad state property \'b<n>\'\n  -j <n>    fake simulation to satisfy justice property \'j<n>\'\n\n  --states                 print all states\n  --vcd <file>             write VCD trace to <file>\n  --hierarchical-symbols   interpret \'.\' in symbol names as hierarchical\n                           module path in VCD\n  --info <file>            read additional information for clocks and\n                           top module name from <file>\n\nand \'<btor>\' is sequential model in \'BTOR\' format\nand \'<witness>\' a trace in \'BTOR\' witness format.\n\nThe simulator either checks a given witness (checking mode) or\nrandomly generates inputs (random mode). If no BTOR model path is\nspecified then it is read from \'<stdin>\'.  The simulator only uses\nchecking mode if both the BTOR model and a witness file are specified.\n"
              ,_stdout);
        exit(0);
      }
      pcVar17 = model_path;
      if ((pcVar18[1] == 'c') && (pcVar18[2] == '\0')) {
        print_trace = '\x01';
      }
      else if ((pcVar18[1] == 'v') && (pcVar18[2] == '\0')) {
        verbosity = verbosity + 1;
      }
      else if ((pcVar18[1] == 'r') && (pcVar18[2] == '\0')) {
        iVar19 = iVar19 + 1;
        if (iVar19 == argc) {
          die("argument to \'-r\' missing");
        }
        pcVar18 = argv[iVar19];
        iVar5 = parse_int(pcVar18,&local_8c);
        pcVar17 = model_path;
        if (iVar5 == 0) {
          pcVar17 = "invalid number in \'-r %s\'";
LAB_00110bf0:
          die(pcVar17,pcVar18);
          pcVar17 = model_path;
        }
      }
      else if ((pcVar18[1] == 's') && (pcVar18[2] == '\0')) {
        iVar19 = iVar19 + 1;
        if (iVar19 == argc) {
          die("argument to \'-s\' missing");
        }
        pcVar18 = argv[iVar19];
        iVar5 = parse_int(pcVar18,(int32_t *)&local_90);
        pcVar17 = model_path;
        if (iVar5 == 0) {
          pcVar17 = "invalid number in \'-s %s\'";
          goto LAB_00110bf0;
        }
      }
      else if ((pcVar18[1] == 'b') && (pcVar18[2] == '\0')) {
        iVar19 = iVar19 + 1;
        if (iVar19 == argc) {
          die("argument to \'-b\' missing");
        }
        pcVar18 = argv[iVar19];
        iVar5 = parse_long(pcVar18,&fake_bad);
        pcVar17 = model_path;
        if (iVar5 == 0) {
          pcVar17 = "invalid number in \'-b %s\'";
          goto LAB_00110bf0;
        }
      }
      else {
        if ((pcVar18[1] != 'j') || (pcVar18[2] != '\0')) goto LAB_001109f0;
        iVar19 = iVar19 + 1;
        if (iVar19 == argc) {
          die("argument to \'-j\' missing");
        }
        pcVar18 = argv[iVar19];
        iVar5 = parse_long(pcVar18,&fake_justice);
        pcVar17 = model_path;
        if (iVar5 == 0) {
          pcVar17 = "invalid number in \'-j %s\'";
          goto LAB_00110bf0;
        }
      }
    }
    else {
LAB_001109f0:
      iVar4 = strcmp(pcVar18,"--states");
      if (iVar4 == 0) {
        print_states = 1;
        pcVar17 = model_path;
      }
      else {
        iVar4 = strcmp(pcVar18,"--vcd");
        if (iVar4 == 0) {
          dump_vcd = '\x01';
          iVar19 = iVar19 + 1;
          if (iVar19 == argc) {
            die("argument to \'--vcd\' missing");
          }
          vcd_path = argv[iVar19];
          pcVar17 = model_path;
        }
        else {
          iVar4 = strcmp(pcVar18,"--hierarchical-symbols");
          if (iVar4 == 0) {
            symbol_fmt = 1;
            pcVar17 = model_path;
          }
          else {
            iVar4 = strcmp(pcVar18,"--info");
            if (iVar4 == 0) {
              iVar19 = iVar19 + 1;
              if (iVar19 == argc) {
                die("argument to \'--info\' missing");
              }
              local_88 = argv[iVar19];
              pcVar17 = model_path;
            }
            else {
              if (cVar1 == '-') {
                pcVar17 = "invalid command line option \'%s\' (try \'-h\')";
                goto LAB_00110bf0;
              }
              if (witness_path == (char *)0x0) {
                pcVar17 = pcVar18;
                if (model_path != (char *)0x0) {
                  witness_path = pcVar18;
                  pcVar17 = model_path;
                }
              }
              else {
                die("too many file arguments \'%s\', \'%s\', and \'%s\'",model_path,witness_path,
                    pcVar18);
                pcVar17 = model_path;
              }
            }
          }
        }
      }
    }
    model_path = pcVar17;
  }
  if (model_path == (char *)0x0) {
    model_path = "<stdin>";
    model_file = _stdin;
  }
  else {
    model_file = (FILE *)fopen(model_path,"r");
    if ((FILE *)model_file == (FILE *)0x0) {
      die("failed to open BTOR model file \'%s\' for reading",model_path);
    }
    close_model_file = '\x01';
  }
  if (witness_path != (char *)0x0) {
    witness_file = (FILE *)fopen(witness_path,"r");
    if ((FILE *)witness_file == (FILE *)0x0) {
      die("failed to open witness file \'%s\' for reading",witness_path);
    }
    close_witness_file = '\x01';
    if ((model_path != (char *)0x0) && (witness_path != (char *)0x0)) {
      msg(1,"checking mode: both model and witness specified");
      random_mode = '\0';
      if (-1 < local_8c) {
        die("number of random test vectors specified in checking mode");
      }
      if (-1 < (int)local_90) {
        die("random seed specified in checking mode");
      }
      if (-1 < fake_bad) {
        die("can not fake bad state property in checking mode");
      }
      if (-1 < fake_justice) {
        die("can not fake justice property in checking mode");
      }
      goto LAB_00110d5a;
    }
  }
  msg(1,"random mode: witness not specified");
  random_mode = '\x01';
LAB_00110d5a:
  if (dump_vcd == '\x01') {
    pBVar7 = (BtorSimVCDWriter *)operator_new(0x2f8);
    BtorSimVCDWriter::BtorSimVCDWriter(pBVar7,vcd_path,false,(bool)symbol_fmt);
    vcd_writer = pBVar7;
    if (local_88 != (char *)0x0) {
      BtorSimVCDWriter::read_info_file_abi_cxx11_
                ((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_60,pBVar7,local_88);
      std::
      _Rb_tree<long,_std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&extra_constraints_abi_cxx11_._M_t,
                  (_Rb_tree<long,_std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_60);
      std::
      _Rb_tree<long,_std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<long,_std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_60);
    }
  }
  msg(1,"reading BTOR model from \'%s\'",model_path);
  model = (Btor2Parser *)btor2parser_new();
  iVar19 = btor2parser_read_lines(model,model_file);
  pcVar18 = model_path;
  if (iVar19 == 0) {
    uVar8 = btor2parser_error(model);
    die("parse error in \'%s\' at %s",pcVar18,uVar8);
  }
  num_format_lines = btor2parser_max_id(model);
  local_60._0_8_ = (value_type)0x0;
  std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::resize
            (&inits,num_format_lines,(value_type *)local_60);
  local_60._0_8_ = (value_type)0x0;
  std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::resize
            (&nexts,num_format_lines,(value_type *)local_60);
  local_60._0_16_ = btor2parser_iter_init(model);
switchD_00110ec8_caseD_0:
  pBVar9 = (Btor2Line *)btor2parser_iter_next(local_60);
  if (pBVar9 == (Btor2Line *)0x0) goto LAB_001110c9;
  _ch = pBVar9;
  switch(pBVar9->tag) {
  case BTOR2_TAG_add:
  case BTOR2_TAG_and:
  case BTOR2_TAG_concat:
  case BTOR2_TAG_const:
  case BTOR2_TAG_constd:
  case BTOR2_TAG_consth:
  case BTOR2_TAG_dec:
  case BTOR2_TAG_eq:
  case BTOR2_TAG_iff:
  case BTOR2_TAG_implies:
  case BTOR2_TAG_inc:
  case BTOR2_TAG_ite:
  case BTOR2_TAG_mul:
  case BTOR2_TAG_nand:
  case BTOR2_TAG_neq:
  case BTOR2_TAG_neg:
  case BTOR2_TAG_nor:
  case BTOR2_TAG_not:
  case BTOR2_TAG_one:
  case BTOR2_TAG_ones:
  case BTOR2_TAG_or:
  case BTOR2_TAG_output:
  case BTOR2_TAG_read:
  case BTOR2_TAG_redand:
  case BTOR2_TAG_redor:
  case BTOR2_TAG_redxor:
  case BTOR2_TAG_rol:
  case BTOR2_TAG_ror:
  case BTOR2_TAG_sdiv:
  case BTOR2_TAG_sext:
  case BTOR2_TAG_sgt:
  case BTOR2_TAG_sgte:
  case BTOR2_TAG_slice:
  case BTOR2_TAG_sll:
  case BTOR2_TAG_slt:
  case BTOR2_TAG_slte:
  case BTOR2_TAG_smod:
  case BTOR2_TAG_sra:
  case BTOR2_TAG_srem:
  case BTOR2_TAG_srl:
  case BTOR2_TAG_sub:
  case BTOR2_TAG_udiv:
  case BTOR2_TAG_uext:
  case BTOR2_TAG_ugt:
  case BTOR2_TAG_ugte:
  case BTOR2_TAG_ult:
  case BTOR2_TAG_ulte:
  case BTOR2_TAG_urem:
  case BTOR2_TAG_write:
  case BTOR2_TAG_xnor:
  case BTOR2_TAG_xor:
  case BTOR2_TAG_zero:
    goto switchD_00110ec8_caseD_0;
  case BTOR2_TAG_bad:
    msg(2,"bad %ld at line %ld",
        (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_start >> 3,pBVar9->lineno);
    std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::push_back(&bads,(value_type *)&ch);
    local_68 = -1;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>(&reached_bads,&local_68);
    num_unreached_bads = num_unreached_bads + 1;
    goto switchD_00110ec8_caseD_0;
  case BTOR2_TAG_constraint:
    msg(2,"constraint %ld at line %ld",
        (long)constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_start >> 3,pBVar9->lineno);
    this = &constraints;
    break;
  default:
    pcVar18 = " ...";
    if (pBVar9->nargs == 0) {
      pcVar18 = "";
    }
    die("parse error in \'%s\' at line %ld: unsupported \'%ld %s%s\'",model_path,pBVar9->lineno,
        pBVar9->id,pBVar9->name,pcVar18);
    goto switchD_00110ec8_caseD_0;
  case BTOR2_TAG_init:
    inits.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
    super__Vector_impl_data._M_start[*pBVar9->args] = pBVar9;
    goto switchD_00110ec8_caseD_0;
  case BTOR2_TAG_input:
    lVar21 = (long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (pBVar9->symbol == (char *)0x0) {
      msg(2,"input %ld at line %ld",lVar21,pBVar9->lineno);
    }
    else {
      msg(2,"input %ld \'%s\' at line %ld",lVar21);
    }
    this = &inputs;
    break;
  case BTOR2_TAG_next:
    nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
    super__Vector_impl_data._M_start[*pBVar9->args] = pBVar9;
    goto switchD_00110ec8_caseD_0;
  case BTOR2_TAG_sort:
    BVar2 = (pBVar9->sort).tag;
    if (BVar2 == BTOR2_TAG_SORT_array) {
      msg(2,"sort array %u %u at line %ld",(pBVar9->sort).field_3.array.index,
          (pBVar9->sort).field_3.array.element,pBVar9->lineno);
    }
    else if (BVar2 == BTOR2_TAG_SORT_bitvec) {
      msg(2,"sort bitvec %u at line %ld",(ulong)(pBVar9->sort).field_3.bitvec.width,pBVar9->lineno);
    }
    else {
      die("parse error in \'%s\' at line %ld: unsupported sort \'%s\'",model_path,pBVar9->lineno,
          (pBVar9->sort).name);
    }
    goto switchD_00110ec8_caseD_0;
  case BTOR2_TAG_state:
    lVar21 = (long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (pBVar9->symbol == (char *)0x0) {
      msg(2,"state %ld at line %ld",lVar21,pBVar9->lineno);
    }
    else {
      msg(2,"state %ld \'%s\' at line %ld",lVar21);
    }
    this = &states;
  }
  std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::push_back(this,(value_type *)&ch);
  goto switchD_00110ec8_caseD_0;
LAB_00111627:
  free(_ZL8constant_0);
  _ZL8constant_0 = (void *)0x0;
  _ZL8constant_1 = 0;
  _ZL8constant_2 = 0;
  free(_ZL6symbol_0);
  _ZL6symbol_0 = (void *)0x0;
  _ZL6symbol_1 = 0;
  _ZL6symbol_2 = 0;
  free(_ZL11array_index_0);
  _ZL11array_index_0 = (void *)0x0;
  _ZL11array_index_1 = 0;
  _ZL11array_index_2 = 0;
  pcVar18 = "finished parsing %ld witnesses after reading %ld bytes (%.1f MB)";
  msg(1,"finished parsing %ld witnesses after reading %ld bytes (%.1f MB)",
      (double)charno * 9.5367431640625e-07,count_witnesses);
  if (close_witness_file == '\x01') {
    iVar19 = fclose((FILE *)witness_file);
    if (iVar19 != 0) {
      pcVar18 = witness_path;
      die("can not close witness file \'%s\'");
    }
  }
  goto LAB_001117ba;
LAB_001110c9:
  ppBVar10 = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppBVar13 = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  for (uVar20 = 0; iVar3 = fake_bad, uVar20 < (ulong)((long)ppBVar10 - (long)ppBVar13 >> 3);
      uVar20 = uVar20 + 1) {
    if (nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
        super__Vector_impl_data._M_start[ppBVar13[uVar20]->id] == (Btor2Line *)0x0) {
      msg(1,"state %d without next function");
      ppBVar10 = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppBVar13 = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
  }
  if ((long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 <= fake_bad) {
    die("invalid faked bad state property number %ld",fake_bad);
  }
  iVar16 = fake_justice;
  if ((long)justices.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)justices.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 <= fake_justice) {
    die("invalid faked justice property number %ld",fake_justice);
  }
  if (close_model_file == '\x01') {
    iVar19 = fclose((FILE *)model_file);
    if (iVar19 != 0) {
      die("can not close model file \'%s\'",model_path);
    }
  }
  setup_states();
  if (random_mode != '\x01') {
    msg(1,"reading BTOR witness from \'%s\'",witness_path);
    _ZL8constant_0 = (void *)0x0;
    _ZL8constant_1 = 0;
    _ZL8constant_2 = 0;
    _ZL6symbol_0 = (void *)0x0;
    _ZL6symbol_1 = 0;
    _ZL6symbol_2 = 0;
    _ZL11array_index_0 = (void *)0x0;
    _ZL11array_index_1 = 0;
    _ZL11array_index_2 = 0;
LAB_0011129b:
    do {
      iVar19 = next_char();
      if (iVar19 == -1) goto LAB_00111627;
      found_end_of_witness = 0;
      if (iVar19 != 0x73) {
        if (iVar19 == 0x23) {
          count_witnesses = count_witnesses + 1;
          count_unknown_witnesses = count_unknown_witnesses + 1;
          if (1 < count_unknown_witnesses + count_sat_witnesses) {
            die("more than one actual witness not supported yet");
          }
          prev_char(0x23);
          msg(1,"parsing unknown witness %ld",count_unknown_witnesses);
          lVar21 = -1;
          do {
            lVar21 = lVar21 + 1;
            iVar5 = parse_frame(lVar21);
          } while (iVar5 != 0);
          report();
          if (print_trace == '\0') {
            puts(".");
            fflush(_stdout);
          }
          msg(1,"finished parsing k = %ld frames",lVar21);
          goto LAB_0011129b;
        }
LAB_00111560:
        if (iVar19 == 0x75) {
          iVar19 = next_char();
          if (iVar19 == 0x6e) {
            iVar19 = next_char();
            if (iVar19 == 0x73) {
              iVar19 = next_char();
              if (iVar19 == 0x61) {
                iVar19 = next_char();
                if (iVar19 == 0x74) {
                  iVar19 = next_char();
                  if (iVar19 == 10) {
                    count_witnesses = count_witnesses + 1;
                    count_unsat_witnesses = count_unsat_witnesses + 1;
                    msg(1,"found witness %ld header \'unsat\' in \'%s\' at line %ld",witness_path,
                        count_unsat_witnesses,lineno + -1);
                    msg(1,"parsing \'unsat\' witness %ld",count_unsat_witnesses);
                    die("\'unsat\' witnesses not supported yet");
                    goto LAB_0011129b;
                  }
                }
              }
            }
          }
        }
        while (iVar19 != 10) {
          iVar19 = next_char();
          if (iVar19 == -1) {
            pcVar18 = "unexpected end-of-file before new-line";
LAB_00111620:
            parse_error(pcVar18);
            goto LAB_00111627;
          }
        }
        goto LAB_0011129b;
      }
      iVar19 = next_char();
      if (iVar19 != 0x61) goto LAB_00111560;
      iVar19 = next_char();
      if (iVar19 != 0x74) goto LAB_00111560;
      iVar19 = next_char();
      if (iVar19 != 10) goto LAB_00111560;
      count_witnesses = count_witnesses + 1;
      count_sat_witnesses = count_sat_witnesses + 1;
      msg(1,"found witness %ld header \'sat\' in \'%s\' at line %ld",count_sat_witnesses,
          witness_path,lineno + -1);
      if (1 < count_witnesses) {
        die("more than one actual witness not supported yet");
      }
      msg(1,"parsing \'sat\' witness %ld",count_sat_witnesses);
      do {
        do {
          uVar6 = next_char();
        } while (uVar6 == 0x20);
        if (uVar6 == 10) break;
        if ((uVar6 & 0xfffffff7) != 0x62) {
          pcVar18 = "expected \'b\' or \'j\'";
          goto LAB_00111620;
        }
        pBVar11 = (value_type)parse_unsigned_number(&ch);
        pBVar9 = _ch;
        iVar5 = ch;
        local_60._0_8_ = pBVar11;
        if ((ch != 10) && (ch != 0x20)) {
          iVar19 = isprint(ch);
          if (iVar19 == 0) {
            pcVar18 = "unexpected character 0x%02x after number (expected space or new-line)";
          }
          else {
            pcVar18 = "unexpected \'%c\' after number (expected space or new-line)";
          }
          parse_error(pcVar18,(ulong)pBVar9 & 0xffffffff);
          operator_delete((void *)0x1);
          _Unwind_Resume(extraout_RAX);
        }
        if (uVar6 != 0x62) {
LAB_00111891:
          pcVar18 = "can not handle justice properties yet";
          goto LAB_00111620;
        }
        if ((long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 <= (long)pBVar11) {
          parse_error("invalid bad state property number %ld",pBVar11);
          goto LAB_00111891;
        }
        msg(3,"... claims to be witness of bad state property number \'b%ld\'",pBVar11);
        std::vector<long,_std::allocator<long>_>::push_back
                  (&claimed_bad_witnesses,(value_type_conflict1 *)local_60);
      } while (iVar5 != 10);
      lVar21 = -1;
      do {
        lVar15 = lVar21;
        lVar21 = lVar15 + 1;
        iVar5 = parse_frame(lVar21);
      } while (iVar5 != 0);
      msg(1,"finished parsing k = %ld frames",lVar21);
      if (dump_vcd == '\x01') {
        BtorSimVCDWriter::update_time(vcd_writer,lVar15 + 2);
      }
      report();
      if (print_trace == '\0') {
        puts(".");
        fflush(_stdout);
      }
      plVar12 = claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      plVar14 = claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (uVar20 = 0; uVar20 < (ulong)((long)plVar12 - (long)plVar14 >> 3); uVar20 = uVar20 + 1) {
        lVar21 = plVar14[uVar20];
        if (reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar21] < 0) {
          die("claimed bad state property \'b%ld\' id %ld not reached",lVar21,
              bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_start[lVar21]->id);
          plVar12 = claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          plVar14 = claimed_bad_witnesses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
    } while( true );
  }
  iVar19 = 0x14;
  if (-1 < local_8c) {
    iVar19 = local_8c;
  }
  uVar6 = local_90;
  if ((int)local_90 < 1) {
    uVar6 = 0;
  }
  msg(1,"using random seed %d",(ulong)uVar6);
  btorsim_rng_init(&rng,uVar6);
  if (print_trace == '\0') {
    if ((iVar16 | iVar3) < 0) {
      if (iVar3 < 0) {
        if (iVar16 < 0) goto LAB_00111721;
        pcVar18 = "sat\nj%ld\n";
      }
      else {
        pcVar18 = "sat\nb%ld\n";
        iVar16 = iVar3;
      }
      printf(pcVar18,iVar16);
    }
    else {
      printf("sat\nb%ld j%ld\n",iVar3,iVar16);
    }
  }
LAB_00111721:
  msg(1,"starting random simulation up to bound %ld",(long)iVar19);
  initialize_states(1);
  initialize_inputs(0,1);
  pcVar18 = (char *)0x1;
  simulate_step(0,1);
  lVar21 = 1;
  while (((lVar21 <= iVar19 && (constraints_violated < 0)) && (num_unreached_bads != 0))) {
    transition(lVar21);
    initialize_inputs(lVar21,1);
    pcVar18 = (char *)0x1;
    simulate_step(lVar21,1);
    lVar21 = lVar21 + 1;
  }
  if (print_trace == '\0') {
    puts(".");
    fflush(_stdout);
  }
  report();
LAB_001117ba:
  if (dump_vcd == '\x01') {
    pcVar18 = (char *)model;
    BtorSimVCDWriter::write_vcd(vcd_writer,model);
    pBVar7 = vcd_writer;
    if (vcd_writer != (BtorSimVCDWriter *)0x0) {
      BtorSimVCDWriter::~BtorSimVCDWriter(vcd_writer);
    }
    operator_delete(pBVar7);
  }
  btor2parser_delete(model);
  lVar15 = 0;
  lVar21 = num_format_lines;
  for (lVar22 = 0; lVar22 < lVar21; lVar22 = lVar22 + 1) {
    if (*(int *)((long)&(current_state.
                         super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                         super__Vector_impl_data._M_start)->type + lVar15) != 0) {
      BtorSimState::remove
                ((BtorSimState *)
                 ((long)&(current_state.
                          super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                          super__Vector_impl_data._M_start)->type + lVar15),pcVar18);
      lVar21 = num_format_lines;
    }
    lVar15 = lVar15 + 0x10;
  }
  lVar15 = 0;
  for (lVar22 = 0; lVar22 < lVar21; lVar22 = lVar22 + 1) {
    if (*(int *)((long)&(next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                         _M_impl.super__Vector_impl_data._M_start)->type + lVar15) != 0) {
      BtorSimState::remove
                ((BtorSimState *)
                 ((long)&(next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>
                          ._M_impl.super__Vector_impl_data._M_start)->type + lVar15),pcVar18);
      lVar21 = num_format_lines;
    }
    lVar15 = lVar15 + 0x10;
  }
  return 0;
}

Assistant:

int32_t
main (int32_t argc, char const *argv[])
{
  const char *info_path = nullptr;
  int64_t fake_bad = -1, fake_justice = -1;
  int32_t r = -1, s = -1;
  for (int32_t i = 1; i < argc; i++)
  {
    if (!strcmp (argv[i], "-h"))
      fputs (usage, stdout), exit (0);
    else if (!strcmp (argv[i], "-c"))
      print_trace = false;
    else if (!strcmp (argv[i], "-v"))
      verbosity++;
    else if (!strcmp (argv[i], "-r"))
    {
      if (++i == argc) die ("argument to '-r' missing");
      if (!parse_int (argv[i], &r)) die ("invalid number in '-r %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "-s"))
    {
      if (++i == argc) die ("argument to '-s' missing");
      if (!parse_int (argv[i], &s)) die ("invalid number in '-s %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "-b"))
    {
      if (++i == argc) die ("argument to '-b' missing");
      if (!parse_long (argv[i], &fake_bad))
        die ("invalid number in '-b %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "-j"))
    {
      if (++i == argc) die ("argument to '-j' missing");
      if (!parse_long (argv[i], &fake_justice))
        die ("invalid number in '-j %s'", argv[i]);
    }
    else if (!strcmp (argv[i], "--states"))
      print_states = true;
    else if (!strcmp (argv[i], "--vcd"))
    {
      dump_vcd = true;
      if (++i == argc) die ("argument to '--vcd' missing");
      vcd_path = argv[i];
    }
    else if (!strcmp (argv[i], "--hierarchical-symbols"))
      symbol_fmt = true;
    else if (!strcmp (argv[i], "--info"))
    {
      if (++i == argc) die ("argument to '--info' missing");
      info_path = argv[i];
    }
    else if (argv[i][0] == '-')
      die ("invalid command line option '%s' (try '-h')", argv[i]);
    else if (witness_path)
      die ("too many file arguments '%s', '%s', and '%s'",
           model_path,
           witness_path,
           argv[i]);
    else if (model_path)
      witness_path = argv[i];
    else
      model_path = argv[i];
  }
  if (model_path)
  {
    if (!(model_file = fopen (model_path, "r")))
      die ("failed to open BTOR model file '%s' for reading", model_path);
    close_model_file = 1;
  }
  else
  {
    model_path = "<stdin>";
    model_file = stdin;
  }
  if (witness_path)
  {
    if (!(witness_file = fopen (witness_path, "r")))
      die ("failed to open witness file '%s' for reading", witness_path);
    close_witness_file = 1;
  }
  if (model_path && witness_path)
  {
    msg (1, "checking mode: both model and witness specified");
    checking_mode = 1;
    random_mode   = 0;
  }
  else
  {
    msg (1, "random mode: witness not specified");
    checking_mode = 0;
    random_mode   = 1;
  }
  if (checking_mode)
  {
    if (r >= 0)
      die ("number of random test vectors specified in checking mode");
    if (s >= 0) die ("random seed specified in checking mode");
    if (fake_bad >= 0) die ("can not fake bad state property in checking mode");
    if (fake_justice >= 0)
      die ("can not fake justice property in checking mode");
  }
  if (dump_vcd)
  {
    vcd_writer = new BtorSimVCDWriter (vcd_path, readable_vcd, symbol_fmt);
    if (info_path)
    {
      extra_constraints = vcd_writer->read_info_file (info_path);
    }
  }
  assert (model_path);
  msg (1, "reading BTOR model from '%s'", model_path);
  parse_model ();
  if (fake_bad >= (int64_t) bads.size ())
    die ("invalid faked bad state property number %" PRId64, fake_bad);
  if (fake_justice >= (int64_t) justices.size ())
    die ("invalid faked justice property number %" PRId64, fake_justice);
  if (close_model_file && fclose (model_file))
    die ("can not close model file '%s'", model_path);
  setup_states ();
  if (random_mode)
  {
    if (r < 0) r = 20;
    if (s < 0) s = 0;
    msg (1, "using random seed %d", s);
    btorsim_rng_init (&rng, (uint32_t) s);
    if (print_trace)
    {
      if (fake_bad >= 0 && fake_justice >= 0)
        printf ("sat\nb%" PRId64 " j%" PRId64 "\n", fake_bad, fake_justice);
      else if (fake_bad >= 0)
        printf ("sat\nb%" PRId64 "\n", fake_bad);
      else if (fake_justice >= 0)
        printf ("sat\nj%" PRId64 "\n", fake_justice);
    }
    random_simulation (r);
  }
  else
  {
    assert (witness_path);
    msg (1, "reading BTOR witness from '%s'", witness_path);
    parse_and_check_all_witnesses ();
    if (close_witness_file && fclose (witness_file))
      die ("can not close witness file '%s'", witness_path);
  }
  if (dump_vcd)
  {
    vcd_writer->write_vcd (model);
    delete vcd_writer;
  }
  btor2parser_delete (model);
  for (int64_t i = 0; i < num_format_lines; i++)
    if (current_state[i].type) current_state[i].remove ();
  for (int64_t i = 0; i < num_format_lines; i++)
    if (next_state[i].type) next_state[i].remove ();
  return 0;
}